

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  _func_int ***ppp_Var1;
  pointer puVar2;
  pointer pfVar3;
  pointer pfVar4;
  pointer pvVar5;
  pointer pvVar6;
  vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
  *pvVar7;
  executor_type *peVar8;
  sockaddr *__addr;
  execution_context eVar9;
  pointer puVar10;
  service *psVar11;
  string_view query_string;
  string_view query_string_00;
  string_view statement;
  string_view statement_00;
  io_context ctx;
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  stmt;
  array<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_2UL>
  select_values;
  array<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_2UL>
  update_values;
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  conn;
  endpoint ep;
  undefined1 local_238 [8];
  undefined1 auStack_230 [32];
  pointer pfStack_210;
  pointer local_208;
  pointer local_200;
  pointer pvStack_1f8;
  pointer local_1f0;
  pointer local_1e8;
  pointer puStack_1e0;
  pointer local_1d8;
  bool local_1d0;
  undefined1 local_1c8 [8];
  resultset_metadata rStack_1c0;
  pointer local_190;
  pointer pvStack_188;
  pointer local_180;
  pointer local_178;
  pointer puStack_170;
  pointer local_168;
  bool local_160;
  execution_context local_150;
  undefined1 local_140 [8];
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 uStack_100;
  char *local_f8;
  undefined8 uStack_f0;
  _Variadic_union<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  char *local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [8];
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  local_b0;
  basic_endpoint<boost::asio::ip::tcp> local_2c;
  
  boost::asio::io_context::io_context((io_context *)&local_150);
  local_1c8 = (undefined1  [8])
              &boost::asio::detail::
               typeid_wrapper<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>>::
               typeinfo;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.next_layer_.
  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.service_ =
       (service_type *)
       boost::asio::detail::service_registry::do_use_service
                 (local_150.service_registry_,(key *)local_1c8,
                  boost::asio::detail::service_registry::
                  create<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,boost::asio::io_context>
                  ,&local_150);
  peVar8 = &local_b0.next_layer_.
            super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            .impl_.executor_;
  local_b0.next_layer_.
  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.implementation_.protocol_.family_ = 2;
  local_b0.next_layer_.
  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.executor_.super_any_executor_base.target_fns_ =
       (target_fns *)
       boost::asio::execution::detail::any_executor_base::
       target_fns_table<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>(bool,std::enable_if<!is_same<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value,void>::type*)
       ::fns_with_execute;
  local_b0.next_layer_.
  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.executor_.super_any_executor_base.object_fns_ =
       (object_fns *)
       boost::asio::execution::detail::any_executor_base::
       object_fns_table<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>(std::enable_if<(!is_same<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value)&&(!is_same<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>,std::shared_ptr<void>>::value),void>::type*)
       ::fns;
  local_b0.next_layer_.
  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.executor_.super_any_executor_base.object_._12_4_ = 0;
  local_b0.next_layer_.
  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.executor_.prop_fns_ =
       (prop_fns<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)boost::asio::execution::
          any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>
          ::prop_fns_table<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>()
          ::fns;
  local_b0.next_layer_.
  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.implementation_.super_base_implementation_type.socket_ = -1;
  local_b0.next_layer_.
  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.implementation_.super_base_implementation_type.state_ = '\0';
  local_b0.channel_.header_buffer_._M_elems[0] = '\0';
  local_b0.channel_.header_buffer_._M_elems[1] = '\0';
  local_b0.channel_.header_buffer_._M_elems[2] = '\0';
  local_b0.channel_.header_buffer_._M_elems[3] = '\0';
  local_b0.channel_.header_buffer_._M_elems[4] = '\0';
  local_b0.channel_.shared_buff_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.channel_.shared_buff_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_b0.channel_.shared_buff_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_b0.channel_.shared_buff_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_b0.channel_.shared_buff_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_b0.curr_stmt_num_ = 0;
  local_1c8 = (undefined1  [8])0x100007f00000000;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.next_layer_.
  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.executor_.super_any_executor_base.object_.__align =
       (anon_struct_8_0_00000001_for___align)&local_150;
  local_b0.next_layer_.
  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.executor_.super_any_executor_base.target_ = peVar8;
  local_b0.channel_.stream_ =
       (basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)(local_b8 + 8);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (&local_2c,(address *)local_1c8,0x1538);
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::connect((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)(local_b8 + 8),(int)&local_2c,__addr,(socklen_t)peVar8);
  local_1c8 = (undefined1  [8])0x8;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "postgres";
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x8;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "postgres";
  rStack_1c0.fields_.super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7;
  rStack_1c0.fields_.super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x112046;
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::handshake((connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
               *)(local_b8 + 8),(connection_params *)local_1c8);
  query_string._M_str = "UPDATE mytable SET f1 = 100 WHERE f2 = \'adios\'";
  query_string._M_len = 0x2e;
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::query((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *)local_1c8,
          (connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *)(local_b8 + 8),query_string);
  while( true ) {
    pvVar7 = &psql::
              resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              ::fetch_one((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                           *)local_1c8)->values_;
    if (pvVar7 == (vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
                   *)0x0) break;
    print(pvVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"UPDATE complete\n\n",0x11);
  query_string_00._M_str = "SELECT * FROM \"mytable\";";
  query_string_00._M_len = 0x18;
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::query((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *)local_238,
          (connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *)(local_b8 + 8),query_string_00);
  puVar10 = rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar2 = rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_1c8 = local_238;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auStack_230._0_8_;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auStack_230._8_8_;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)auStack_230._16_8_;
  auStack_230._0_8_ = (pointer)0x0;
  auStack_230._8_8_ = (pointer)0x0;
  auStack_230._16_8_ = (pointer)0x0;
  if ((id *)puVar2 != (id *)0x0) {
    operator_delete(puVar2,(long)puVar10 - (long)puVar2);
  }
  pfVar4 = rStack_1c0.fields_.
           super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pfVar3 = rStack_1c0.fields_.
           super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>._M_impl.
           super__Vector_impl_data._M_start;
  rStack_1c0.fields_.super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_230._24_8_;
  rStack_1c0.fields_.super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>
  ._M_impl.super__Vector_impl_data._M_finish = pfStack_210;
  rStack_1c0.fields_.super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_208;
  auStack_230._24_8_ = (pointer)0x0;
  pfStack_210 = (pointer)0x0;
  local_208 = (pointer)0x0;
  if (pfVar3 != (pointer)0x0) {
    operator_delete(pfVar3,(long)pfVar4 - (long)pfVar3);
  }
  pvVar6 = local_180;
  pvVar5 = local_190;
  local_190 = local_200;
  pvStack_188 = pvStack_1f8;
  local_180 = local_1f0;
  local_200 = (pointer)0x0;
  pvStack_1f8 = (pointer)0x0;
  local_1f0 = (pointer)0x0;
  if (pvVar5 != (pointer)0x0) {
    operator_delete(pvVar5,(long)pvVar6 - (long)pvVar5);
  }
  puVar10 = local_168;
  puVar2 = local_178;
  local_178 = local_1e8;
  puStack_170 = puStack_1e0;
  local_168 = local_1d8;
  local_1e8 = (pointer)0x0;
  puStack_1e0 = (pointer)0x0;
  local_1d8 = (pointer)0x0;
  if (puVar2 == (pointer)0x0) {
    local_160 = local_1d0;
  }
  else {
    operator_delete(puVar2,(long)puVar10 - (long)puVar2);
    local_160 = local_1d0;
    if (local_1e8 != (pointer)0x0) {
      operator_delete(local_1e8,(long)local_1d8 - (long)local_1e8);
    }
  }
  if (local_200 != (pointer)0x0) {
    operator_delete(local_200,(long)local_1f0 - (long)local_200);
  }
  psql::resultset_metadata::~resultset_metadata((resultset_metadata *)auStack_230);
  while( true ) {
    pvVar7 = &psql::
              resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              ::fetch_one((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                           *)local_1c8)->values_;
    if (pvVar7 == (vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
                   *)0x0) break;
    print(pvVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"SELECT complete\n\n",0x11);
  local_c8 = "adios";
  uStack_c0 = 4;
  local_d8 = 0;
  uStack_d0 = 5;
  local_e8._M_rest._0_8_ = (undefined8)0x96;
  local_e8._8_8_ = 0;
  statement._M_str = "UPDATE mytable SET f1 = $1 WHERE f2 = $2";
  statement._M_len = 0x28;
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::prepare_statement((prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)local_140,
                      (connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)(local_b8 + 8),statement);
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::
  execute<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>*>
            ((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              *)local_238,local_140,
             (variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
              *)&local_e8._M_first,
             (variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
              *)local_b8);
  puVar10 = rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar2 = rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_1c8 = local_238;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auStack_230._0_8_;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auStack_230._8_8_;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)auStack_230._16_8_;
  auStack_230._0_8_ = (pointer)0x0;
  auStack_230._8_8_ = (pointer)0x0;
  auStack_230._16_8_ = (pointer)0x0;
  if ((id *)puVar2 != (id *)0x0) {
    operator_delete(puVar2,(long)puVar10 - (long)puVar2);
  }
  pfVar4 = rStack_1c0.fields_.
           super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pfVar3 = rStack_1c0.fields_.
           super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>._M_impl.
           super__Vector_impl_data._M_start;
  rStack_1c0.fields_.super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_230._24_8_;
  rStack_1c0.fields_.super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>
  ._M_impl.super__Vector_impl_data._M_finish = pfStack_210;
  rStack_1c0.fields_.super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_208;
  auStack_230._24_8_ = (pointer)0x0;
  pfStack_210 = (pointer)0x0;
  local_208 = (pointer)0x0;
  if (pfVar3 != (pointer)0x0) {
    operator_delete(pfVar3,(long)pfVar4 - (long)pfVar3);
  }
  pvVar6 = local_180;
  pvVar5 = local_190;
  local_190 = local_200;
  pvStack_188 = pvStack_1f8;
  local_180 = local_1f0;
  local_200 = (pointer)0x0;
  pvStack_1f8 = (pointer)0x0;
  local_1f0 = (pointer)0x0;
  if (pvVar5 != (pointer)0x0) {
    operator_delete(pvVar5,(long)pvVar6 - (long)pvVar5);
  }
  puVar10 = local_168;
  puVar2 = local_178;
  local_178 = local_1e8;
  puStack_170 = puStack_1e0;
  local_168 = local_1d8;
  local_1e8 = (pointer)0x0;
  puStack_1e0 = (pointer)0x0;
  local_1d8 = (pointer)0x0;
  if (puVar2 == (pointer)0x0) {
    local_160 = local_1d0;
  }
  else {
    puVar10 = puVar10 + -(long)puVar2;
    operator_delete(puVar2,(ulong)puVar10);
    local_160 = local_1d0;
    if (local_1e8 != (pointer)0x0) {
      puVar10 = local_1d8 + -(long)local_1e8;
      operator_delete(local_1e8,(ulong)puVar10);
    }
  }
  if (local_200 != (pointer)0x0) {
    puVar10 = (pointer)((long)local_1f0 - (long)local_200);
    operator_delete(local_200,(ulong)puVar10);
  }
  psql::resultset_metadata::~resultset_metadata((resultset_metadata *)auStack_230);
  while( true ) {
    pvVar7 = &psql::
              resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              ::fetch_one((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                           *)local_1c8)->values_;
    if (pvVar7 == (vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
                   *)0x0) break;
    print(pvVar7);
  }
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::close((prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *)local_140,(int)puVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Prepared UPDATE complete\n\n",0x1a);
  local_f8 = "quetal";
  uStack_f0 = 4;
  local_108._0_1_ = '\x04';
  local_108._1_7_ = 0;
  uStack_100 = 6;
  local_118._0_8_ = 4;
  local_118._8_8_ = "hola";
  statement_00._M_str = "SELECT * FROM mytable WHERE f2 IN ($1, $2)";
  statement_00._M_len = 0x2a;
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::prepare_statement((prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)local_238,
                      (connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)(local_b8 + 8),statement_00);
  local_140 = local_238;
  std::__cxx11::string::operator=((string *)&local_138,(string *)auStack_230);
  if ((undefined1 *)auStack_230._0_8_ != auStack_230 + 0x10) {
    operator_delete((void *)auStack_230._0_8_,(ulong)(auStack_230._16_8_ + 1));
  }
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::
  execute<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>*>
            ((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              *)local_238,local_140,
             (variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
              *)local_118,
             (variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
              *)&local_e8._M_first);
  puVar10 = rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar2 = rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_1c8 = local_238;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auStack_230._0_8_;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auStack_230._8_8_;
  rStack_1c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)auStack_230._16_8_;
  auStack_230._0_8_ = (pointer)0x0;
  auStack_230._8_8_ = (pointer)0x0;
  auStack_230._16_8_ = (pointer)0x0;
  if ((id *)puVar2 != (id *)0x0) {
    operator_delete(puVar2,(long)puVar10 - (long)puVar2);
  }
  pfVar4 = rStack_1c0.fields_.
           super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pfVar3 = rStack_1c0.fields_.
           super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>._M_impl.
           super__Vector_impl_data._M_start;
  rStack_1c0.fields_.super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_230._24_8_;
  rStack_1c0.fields_.super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>
  ._M_impl.super__Vector_impl_data._M_finish = pfStack_210;
  rStack_1c0.fields_.super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_208;
  auStack_230._24_8_ = (pointer)0x0;
  pfStack_210 = (pointer)0x0;
  local_208 = (pointer)0x0;
  if (pfVar3 != (pointer)0x0) {
    operator_delete(pfVar3,(long)pfVar4 - (long)pfVar3);
  }
  pvVar6 = local_180;
  pvVar5 = local_190;
  local_190 = local_200;
  pvStack_188 = pvStack_1f8;
  local_180 = local_1f0;
  local_200 = (pointer)0x0;
  pvStack_1f8 = (pointer)0x0;
  local_1f0 = (pointer)0x0;
  if (pvVar5 != (pointer)0x0) {
    operator_delete(pvVar5,(long)pvVar6 - (long)pvVar5);
  }
  puVar10 = local_168;
  puVar2 = local_178;
  local_178 = local_1e8;
  puStack_170 = puStack_1e0;
  local_168 = local_1d8;
  local_1e8 = (pointer)0x0;
  puStack_1e0 = (pointer)0x0;
  local_1d8 = (pointer)0x0;
  if (puVar2 == (pointer)0x0) {
    local_160 = local_1d0;
  }
  else {
    puVar10 = puVar10 + -(long)puVar2;
    operator_delete(puVar2,(ulong)puVar10);
    local_160 = local_1d0;
    if (local_1e8 != (pointer)0x0) {
      puVar10 = local_1d8 + -(long)local_1e8;
      operator_delete(local_1e8,(ulong)puVar10);
    }
  }
  if (local_200 != (pointer)0x0) {
    puVar10 = (pointer)((long)local_1f0 - (long)local_200);
    operator_delete(local_200,(ulong)puVar10);
  }
  psql::resultset_metadata::~resultset_metadata((resultset_metadata *)auStack_230);
  while( true ) {
    pvVar7 = &psql::
              resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              ::fetch_one((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                           *)local_1c8)->values_;
    if (pvVar7 == (vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
                   *)0x0) break;
    print(pvVar7);
  }
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::close((prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *)local_140,(int)puVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Prepared SELECT complete\n\n",0x1a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_p != &local_128) {
    operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
  }
  if (local_178 != (pointer)0x0) {
    operator_delete(local_178,(long)local_168 - (long)local_178);
  }
  if (local_190 != (pointer)0x0) {
    operator_delete(local_190,(long)local_180 - (long)local_190);
  }
  psql::resultset_metadata::~resultset_metadata(&rStack_1c0);
  if (local_b0.channel_.shared_buff_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.channel_.shared_buff_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_b0.channel_.shared_buff_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_b0.channel_.shared_buff_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_b0.channel_.shared_buff_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)(local_b8 + 8));
  psVar11 = (local_150.service_registry_)->first_service_;
  eVar9.service_registry_ = local_150.service_registry_;
  if (psVar11 != (service *)0x0) {
    do {
      (*psVar11->_vptr_service[2])(psVar11);
      eVar9.service_registry_ = local_150.service_registry_;
      psVar11 = psVar11->next_;
    } while (psVar11 != (service *)0x0);
    psVar11 = (local_150.service_registry_)->first_service_;
    if (psVar11 != (service *)0x0) {
      do {
        ppp_Var1 = &psVar11->_vptr_service;
        psVar11 = psVar11->next_;
        (*(*ppp_Var1)[1])();
        (eVar9.service_registry_)->first_service_ = psVar11;
      } while (psVar11 != (service *)0x0);
      eVar9.service_registry_ = local_150.service_registry_;
      if (local_150.service_registry_ == (service_registry *)0x0) {
        eVar9.service_registry_ = (service_registry *)0x0;
        goto LAB_0010628b;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)&(eVar9.service_registry_)->mutex_);
LAB_0010628b:
  operator_delete(eVar9.service_registry_,0x40);
  return 0;
}

Assistant:

int main()
{
	// Connection
	net::io_context ctx;
	connection<tcp::socket> conn (ctx);
	boost::asio::ip::tcp::endpoint ep (boost::asio::ip::address_v4::loopback(), 5432);

	// Handshake
	conn.next_layer().connect(ep);
	conn.handshake(connection_params{
		"postgres",
		"postgres",
		"awesome"
	});

	// Query (resultset without fields)
	auto result = conn.query("UPDATE mytable SET f1 = 100 WHERE f2 = 'adios'");
	while (const row* r = result.fetch_one())
	{
		print(r->values());
	}
	std::cout << "UPDATE complete\n\n";

	// Query (resultset with fields)
	result = conn.query("SELECT * FROM \"mytable\";");
	while (const row* r = result.fetch_one())
	{
		print(r->values());
	}
	std::cout << "SELECT complete\n\n";

	// Prepared statement (resultset without fields)
	std::array<value, 2> update_values { value(150), value("adios") };
	auto stmt = conn.prepare_statement("UPDATE mytable SET f1 = $1 WHERE f2 = $2");
	result = stmt.execute(std::begin(update_values), std::end(update_values));
	while (const row* r = result.fetch_one())
	{
		print(r->values());
	}
	stmt.close();
	std::cout << "Prepared UPDATE complete\n\n";


	std::array<value, 2> select_values { value("hola"), value("quetal") };
	stmt = conn.prepare_statement("SELECT * FROM mytable WHERE f2 IN ($1, $2)");
	result = stmt.execute(std::begin(select_values), std::end(select_values));
	while (const row* r = result.fetch_one())
	{
		print(r->values());
	}
	stmt.close();
	std::cout << "Prepared SELECT complete\n\n";
}